

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O3

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::ThemeChangeEvent>(void)

{
  char cVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  long in_FS_OFFSET;
  WindowSystemEvent local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QThread::isMainThread();
  if (cVar1 == '\0') {
    QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
    handleEvent<QWindowSystemInterfacePrivate::ThemeChangeEvent>();
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      bVar2 = QWindowSystemInterface::flushWindowSystemEvents((ProcessEventsFlags)0x0);
      return bVar2;
    }
    goto LAB_0032fe39;
  }
  local_20.type = ThemeChange;
  local_20.flags = 0;
  local_20.eventAccepted = true;
  local_20._17_7_ = 0xaaaaaaaaaaaaaa;
  local_20._vptr_WindowSystemEvent = (_func_int **)&PTR__WindowSystemEvent_007d9078;
  if (QWindowSystemInterfacePrivate::eventHandler == (QWindowSystemEventHandler *)0x0) {
    QGuiApplicationPrivate::processWindowSystemEvent(&local_20);
LAB_0032fe20:
    uVar3 = local_20.eventAccepted;
  }
  else {
    iVar4 = (*QWindowSystemInterfacePrivate::eventHandler->_vptr_QWindowSystemEventHandler[2])
                      (QWindowSystemInterfacePrivate::eventHandler,&local_20);
    if ((char)iVar4 != '\0') goto LAB_0032fe20;
    uVar3 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)uVar3;
  }
LAB_0032fe39:
  __stack_chk_fail();
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent(Args ...args)
{
    if (QThread::isMainThread()) {
        EventType event(args...);
        // Process the event immediately on the Gui thread and return the accepted state
        if (QWindowSystemInterfacePrivate::eventHandler) {
            if (!QWindowSystemInterfacePrivate::eventHandler->sendEvent(&event))
                return false;
        } else {
            QGuiApplicationPrivate::processWindowSystemEvent(&event);
        }
        return event.eventAccepted;
    } else {
        // Post the event on the Qt main thread queue and flush the queue.
        // This will wake up the Gui thread which will process the event.
        // Return the accepted state for the last event on the queue,
        // which is the event posted by this function.
        QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
        return QWindowSystemInterface::flushWindowSystemEvents();
    }
}